

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O2

uint __thiscall llvm::AArch64::getDefaultExtensions(AArch64 *this,StringRef CPU,ArchKind AK)

{
  bool bVar1;
  int iVar2;
  uint *puVar3;
  char *pcVar4;
  AlignedCharArray<4UL,_4UL> AVar5;
  AlignedCharArray<4UL,_4UL> AVar6;
  bool bVar7;
  Optional<unsigned_int> local_38;
  
  pcVar4 = CPU.Data;
  if (pcVar4 == (char *)0x7) {
    iVar2 = bcmp(this,"generic",7);
    if (iVar2 == 0) {
      return *(uint *)(&DAT_00183f94 + (ulong)(uint)CPU.Length * 0x40);
    }
  }
  local_38.Storage.hasVal = false;
  AVar5.buffer[0] = '\x1e';
  AVar5.buffer[1] = '\0';
  AVar5.buffer[2] = '\0';
  AVar5.buffer[3] = '\0';
  if (pcVar4 == (char *)0xa) {
    iVar2 = bcmp(this,"cortex-a35",10);
    if (iVar2 == 0) {
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
           (AlignedCharArray<4UL,_4UL>)(char  [4])0x1e;
      local_38.Storage.hasVal = true;
      bVar1 = true;
      goto LAB_00145e98;
    }
    iVar2 = bcmp(this,"cortex-a53",10);
    bVar7 = false;
    bVar1 = false;
    if (iVar2 != 0) goto LAB_00145ea0;
LAB_00145f6e:
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x1e';
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
LAB_00145f89:
    local_38.Storage.hasVal = true;
    bVar1 = true;
LAB_00145f94:
    bVar7 = pcVar4 == (char *)0x9;
    if ((((bVar7 && !bVar1) && (iVar2 = bcmp(this,"exynos-m2",9), iVar2 == 0)) ||
        ((bVar7 && !bVar1 && (iVar2 = bcmp(this,"exynos-m3",9), iVar2 == 0)))) ||
       ((bVar7 && !bVar1 && (iVar2 = bcmp(this,"exynos-m4",9), iVar2 == 0)))) goto LAB_00146081;
    if ((pcVar4 == (char *)0x6 && !bVar1) && (iVar2 = bcmp(this,"falkor",6), iVar2 == 0)) {
      AVar5.buffer[0] = '\x1e';
      AVar5.buffer[1] = '\x10';
      AVar5.buffer[2] = '\0';
      AVar5.buffer[3] = '\0';
      goto LAB_00146081;
    }
    if ((pcVar4 == (char *)0x7 && !bVar1) && (iVar2 = bcmp(this,"saphira",7), iVar2 == 0)) {
      AVar5.buffer[0] = -0x22;
      AVar5.buffer[1] = '\x19';
      AVar5.buffer[2] = '\0';
      AVar5.buffer[3] = '\0';
      goto LAB_00146081;
    }
    if ((pcVar4 == (char *)0x4 && !bVar1) && (*(int *)this == 0x6f79726b)) goto LAB_00146081;
  }
  else {
    bVar1 = false;
LAB_00145e98:
    bVar7 = pcVar4 != (char *)0xa;
LAB_00145ea0:
    if ((!bVar7 && !bVar1) && (iVar2 = bcmp(this,"cortex-a55",10), iVar2 == 0)) {
LAB_00145f73:
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = -0x42;
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\x1d';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
      goto LAB_00145f89;
    }
    if ((((!bVar7 && !bVar1) && (iVar2 = bcmp(this,"cortex-a57",10), iVar2 == 0)) ||
        ((!bVar7 && !bVar1 && (iVar2 = bcmp(this,"cortex-a72",10), iVar2 == 0)))) ||
       ((!bVar7 && !bVar1 && (iVar2 = bcmp(this,"cortex-a73",10), iVar2 == 0)))) goto LAB_00145f6e;
    if ((!bVar7 && !bVar1) && (iVar2 = bcmp(this,"cortex-a75",10), iVar2 == 0)) goto LAB_00145f73;
    if (pcVar4 == (char *)0x7 && !bVar1) {
      iVar2 = bcmp(this,"cyclone",7);
      if (iVar2 != 0) goto LAB_00145f94;
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
           (AlignedCharArray<4UL,_4UL>)(char  [4])0x1d;
      goto LAB_00145f89;
    }
    if ((pcVar4 != (char *)0x9 || bVar1) || (iVar2 = bcmp(this,"exynos-m1",9), iVar2 != 0))
    goto LAB_00145f94;
LAB_00146081:
    local_38.Storage.hasVal = true;
    bVar1 = true;
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
         (AlignedCharArray<4UL,_4UL>)(AlignedCharArray<4UL,_4UL>)AVar5.buffer;
  }
  AVar6.buffer[0] = '^';
  AVar6.buffer[1] = '\0';
  AVar6.buffer[2] = '\0';
  AVar6.buffer[3] = '\0';
  if (pcVar4 == (char *)0xc && !bVar1) {
    iVar2 = bcmp(this,"thunderx2t99",0xc);
    bVar7 = true;
    if (iVar2 == 0) {
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x1f';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\x11';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
LAB_0014610a:
      bVar7 = true;
      local_38.Storage.hasVal = true;
      bVar1 = true;
    }
LAB_00146116:
    if (((bVar7) || ((bVar1 || (iVar2 = bcmp(this,"thunderxt81",0xb), iVar2 != 0)))) &&
       ((bVar7 || bVar1 || (iVar2 = bcmp(this,"thunderxt83",0xb), iVar2 != 0)))) {
      if ((pcVar4 != (char *)0x7 || bVar1) || (iVar2 = bcmp(this,"invalid",7), iVar2 != 0)) {
        if (!bVar1) {
          return 0;
        }
        goto LAB_00146183;
      }
      AVar6.buffer[0] = '\x01';
      AVar6.buffer[1] = '\0';
      AVar6.buffer[2] = '\0';
      AVar6.buffer[3] = '\0';
    }
  }
  else {
    if (pcVar4 == (char *)0x8 && !bVar1) {
      bVar7 = true;
      if (*(long *)this == 0x787265646e756874) {
        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '^';
        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
        goto LAB_0014610a;
      }
      goto LAB_00146116;
    }
    bVar7 = pcVar4 != (char *)0xb;
    if ((bVar7 || bVar1) || (iVar2 = bcmp(this,"thunderxt88",0xb), iVar2 != 0)) goto LAB_00146116;
  }
  local_38.Storage.hasVal = true;
  local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
       (AlignedCharArray<4UL,_4UL>)(AlignedCharArray<4UL,_4UL>)AVar6.buffer;
LAB_00146183:
  puVar3 = Optional<unsigned_int>::getPointer(&local_38);
  return *puVar3;
}

Assistant:

unsigned llvm::AArch64::getDefaultExtensions(StringRef CPU, ArchKind AK) {
  if (CPU == "generic")
    return AArch64ARCHNames[static_cast<unsigned>(AK)].ArchBaseExtensions;

  return StringSwitch<unsigned>(CPU)
#define AARCH64_CPU_NAME(NAME, ID, DEFAULT_FPU, IS_DEFAULT, DEFAULT_EXT)       \
  .Case(NAME,                                                                  \
        AArch64ARCHNames[static_cast<unsigned>(AArch64::ArchKind::ID)] \
            .ArchBaseExtensions | \
            DEFAULT_EXT)
#include "llvm/Support/AArch64TargetParser.def"
    .Default(AArch64::AEK_INVALID);
}